

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeGetNonlinSolvStats(void *cvode_mem,long *nniters,long *nnfails)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNonlinSolvStats","cvode_mem = NULL illegal."
                  );
  }
  else {
    *nniters = *(long *)((long)cvode_mem + 0x370);
    *nnfails = *(long *)((long)cvode_mem + 0x378);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNonlinSolvStats(void *cvode_mem, long int *nniters,
                            long int *nnfails)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE",
                   "CVodeGetNonlinSolvStats", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  *nniters = cv_mem->cv_nni;
  *nnfails = cv_mem->cv_nnf;

  return(CV_SUCCESS);
}